

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_help.cpp
# Opt level: O2

int __thiscall ktx::CommandHelp::main(CommandHelp *this,int argc,char **argv)

{
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"ktx help",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "Displays the man page of a specific ktx command specified as the command argument.\nIf the command option is missing the main ktx tool man page will be displayed."
             ,&local_62);
  Command::parseCommandLine(&this->super_Command,&local_60,&local_40,argc,argv);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  executeHelp(this);
  return 0;
}

Assistant:

int CommandHelp::main(int argc, char* argv[]) {
    try {
        parseCommandLine("ktx help",
                "Displays the man page of a specific ktx command specified as the command argument."
                "\nIf the command option is missing the main ktx tool man page will be displayed.",
                argc, argv);
        executeHelp();
        return +rc::SUCCESS;
    } catch (const FatalError& error) {
        return +error.returnCode;
    } catch (const std::exception& e) {
        fmt::print(std::cerr, "{} fatal: {}\n", commandName, e.what());
        return +rc::RUNTIME_ERROR;
    }
}